

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev3dev.h
# Opt level: O2

string * __thiscall ev3dev::motor::address_abi_cxx11_(string *__return_storage_ptr__,motor *this)

{
  allocator local_39;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,"address",&local_39);
  device::get_attr_string(__return_storage_ptr__,&this->super_device,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string address() const { return get_attr_string("address"); }